

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewKalmanFilter.c
# Opt level: O1

double * kalman_GPS_INS_pv(double *Dpv,double Ve,double Vn,double Vu,double L,double h,
                          double *mahonyR,double *Fn,double tao,double Rm,double Rn)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  byte bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double Rk [6];
  double Q_diag [6];
  double matrixH [6] [15];
  double local_db8 [13];
  double local_d50;
  double local_d48;
  double local_d38;
  double local_d30;
  double local_d28;
  double local_d20;
  double local_d18;
  double local_d10;
  double local_d08;
  double local_d00;
  double local_cf8;
  double local_cf0;
  double local_ce8;
  double local_ce0;
  double local_cd8 [6];
  double local_ca8;
  double local_c28;
  undefined8 local_be8 [15];
  undefined8 local_b70 [15];
  undefined8 local_af8 [15];
  undefined8 local_a80 [15];
  double local_a08;
  double local_a00;
  double local_9f8;
  double local_9d8;
  double local_9d0;
  double local_9c8;
  double local_9a8;
  double local_9a0;
  double local_998;
  double local_960;
  double local_958;
  double local_950;
  double local_930;
  double local_928;
  double local_920;
  double local_900;
  double local_8f8;
  double local_8f0;
  undefined1 local_8e8 [432];
  double local_738;
  double local_730;
  double local_728;
  undefined8 local_720;
  double local_718;
  undefined8 local_710;
  double local_708;
  undefined8 local_700;
  double local_6f8;
  double local_6f0;
  double local_6e8;
  double local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  double local_6c0;
  undefined8 local_6b8;
  double local_6b0;
  double local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  double local_680;
  double local_678;
  double local_670;
  double local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  double local_648;
  double local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  double local_628;
  undefined8 local_620;
  double local_618;
  undefined8 local_610;
  double local_608;
  double local_600;
  double local_5f8;
  double local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  undefined8 local_598;
  double local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  double local_570;
  double local_568;
  double local_560;
  double local_558;
  undefined8 local_550;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  double local_528;
  undefined8 local_520;
  double local_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  undefined8 local_4d0;
  double local_4c8;
  double local_4c0;
  undefined8 local_4b8;
  double local_4b0;
  undefined8 local_4a8;
  double local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  double local_480;
  double local_478;
  double local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  double dStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  double local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  double local_3d0;
  undefined8 uStack_3c8;
  double local_3c0;
  undefined8 uStack_3b8;
  double local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 local_378 [15];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  double dStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  double local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  double dStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  double dStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  double local_38;
  
  bVar18 = 0;
  Q_wa = G0 * 5e-05 * G0 * 5e-05;
  local_d08 = Q_wg;
  local_d00 = Q_wg;
  local_cf8 = Q_wg;
  local_d38 = Rlamt;
  local_d30 = Rl;
  local_d28 = Rh;
  local_d20 = Rvx;
  local_d18 = Rvy;
  local_d10 = Rvz;
  local_db8[0] = 3.0778701138811943e-06;
  local_db8[1] = 3.0778701138811943e-06;
  local_db8[2] = 3.0778701138811943e-06;
  local_db8[3] = 0.0001;
  local_db8[4] = 0.0001;
  local_db8[5] = 0.0001;
  local_db8[6] = 0.0;
  local_db8[7] = 0.0;
  local_db8[8] = 0.0;
  local_db8[9] = 2.3748997792293167e-13;
  local_db8[10] = 2.3748997792293167e-13;
  local_db8[0xb] = 2.3748997792293167e-13;
  local_db8[0xc] = G0 * 0.0001 * G0 * 0.0001;
  local_d50 = G0 * 0.0001 * G0 * 0.0001;
  local_d48 = G0 * 0.0001 * G0 * 0.0001;
  local_cf0 = Q_wa;
  local_ce8 = Q_wa;
  local_ce0 = Q_wa;
  Q = MatDiag(&local_d08,6);
  R = MatDiag(&local_d38,6);
  if (PP == (double *)0x0) {
    PP = MatDiag(local_db8,0xf);
  }
  if (X == (double *)0x0) {
    pdVar11 = (double *)malloc(0x78);
    X = pdVar11;
    *pdVar11 = 0.0;
    pdVar11[1] = 0.0;
    pdVar11[2] = 0.0;
    pdVar11[3] = 0.0;
    pdVar11[4] = 0.0;
    pdVar11[5] = 0.0;
    pdVar11[6] = 0.0;
    pdVar11[7] = 0.0;
    pdVar11[8] = 0.0;
    pdVar11[9] = 0.0;
    pdVar11[10] = 0.0;
    pdVar11[0xb] = 0.0;
    pdVar11[0xc] = 0.0;
    pdVar11[0xd] = 0.0;
    pdVar11[0xe] = 0.0;
  }
  dVar1 = *Fn;
  dVar2 = Fn[1];
  dVar3 = Fn[2];
  dVar4 = sin(L);
  dVar5 = sin(L);
  dVar19 = 1.0 / (dVar5 * dVar4);
  dVar4 = Rn + h;
  dVar20 = dVar4 * dVar4;
  dVar5 = Rm + h;
  dVar21 = -1.0 / Tg[0];
  dVar6 = -1.0 / Ta[0];
  dVar22 = dVar5 * dVar5;
  local_738 = 0.0;
  dVar7 = sin(L);
  dVar8 = tan(L);
  local_730 = dVar7 * -7.292e-05 - (dVar8 * Ve) / dVar4;
  local_720 = 0;
  local_718 = 1.0 / dVar4;
  local_710 = 0;
  local_728 = Vn / dVar5;
  local_708 = sin(L);
  local_708 = local_708 * -7.292e-05;
  local_700 = 0;
  local_6f8 = -Ve / dVar20;
  local_6f0 = *mahonyR;
  local_6e8 = mahonyR[3];
  local_6e0 = mahonyR[6];
  local_6c8 = 0;
  local_6d8 = 0;
  uStack_6d0 = 0;
  dVar7 = sin(L);
  dVar8 = tan(L);
  local_6c0 = dVar7 * 7.292e-05 + (dVar8 * Ve) / dVar4;
  local_6b8 = 0;
  dVar7 = cos(L);
  dVar23 = Ve / dVar4;
  local_6b0 = dVar7 * 7.292e-05 + dVar23;
  local_6a8 = -1.0 / dVar5;
  local_680 = Vn / dVar22;
  local_6a0 = 0;
  uStack_698 = 0;
  local_690 = 0;
  uStack_688 = 0;
  local_678 = mahonyR[1];
  local_670 = mahonyR[4];
  local_668 = mahonyR[7];
  dVar7 = -Vn / dVar5;
  local_650 = 0;
  local_660 = 0;
  uStack_658 = 0;
  local_648 = dVar7;
  dVar8 = cos(L);
  local_640 = dVar8 * -7.292e-05 - dVar23;
  local_638 = 0;
  uStack_630 = 0;
  dVar8 = tan(L);
  local_628 = -dVar8 / dVar4;
  local_620 = 0;
  dVar8 = cos(L);
  dVar24 = (dVar19 * Ve) / dVar4;
  local_618 = dVar8 * -7.292e-05 - dVar24;
  local_610 = 0;
  dVar8 = tan(L);
  local_608 = (dVar8 * Ve) / dVar20;
  local_600 = mahonyR[2];
  local_5f8 = mahonyR[5];
  local_5f0 = mahonyR[8];
  local_5d8 = 0;
  uStack_5d0 = 0;
  local_5e8 = 0;
  uStack_5e0 = 0;
  local_5c8 = -dVar3;
  local_5b8 = Vu / dVar5;
  local_5c0 = dVar1;
  dVar8 = sin(L);
  dVar9 = tan(L);
  dVar10 = tan(L);
  local_5b0 = (dVar8 * -0.00014584 - (dVar9 * Ve) / dVar4) - (dVar10 * Ve) / dVar4;
  local_5a8 = Vn / dVar5;
  dVar8 = cos(L);
  dVar9 = Ve * Ve;
  local_5a0 = dVar8 * -0.00014584 * Ve - (dVar19 * dVar9) / dVar4;
  local_598 = 0;
  dVar8 = tan(L);
  local_590 = (dVar8 * dVar9) / dVar20 - (Vn * Vu) / dVar22;
  local_588 = 0;
  uStack_580 = 0;
  local_578 = 0;
  local_570 = *mahonyR;
  local_568 = mahonyR[3];
  local_560 = mahonyR[6];
  local_550 = 0;
  local_548 = -dVar2;
  local_558 = dVar3;
  dVar3 = sin(L);
  dVar8 = tan(L);
  local_540 = dVar3 * 0.00014584 + (dVar8 * Ve) / dVar4;
  dVar3 = tan(L);
  local_538 = (dVar3 * Vn + Vu) / dVar4;
  dVar3 = cos(L);
  local_530 = dVar3 * 0.00014584 + dVar23;
  dVar3 = cos(L);
  dVar8 = sin(L);
  local_528 = (dVar3 * 0.00014584 + dVar24) * Vn + Vu * -0.00014584 * dVar8;
  local_520 = 0;
  dVar3 = tan(L);
  local_518 = (dVar3 * Ve * Vn - Vu * Ve) / dVar20;
  local_510 = 0;
  uStack_508 = 0;
  local_500 = 0;
  local_4f8 = mahonyR[1];
  local_4f0 = mahonyR[4];
  local_4e8 = mahonyR[7];
  local_4e0 = -dVar1;
  local_4d0 = 0;
  local_4d8 = dVar2;
  local_4c8 = dVar7;
  dVar1 = cos(L);
  local_4c0 = dVar1 * -0.00014584 - (Ve + Ve) / dVar4;
  local_4b8 = 0;
  local_4b0 = sin(L);
  local_4b0 = local_4b0 * (Ve + Ve) * 7.292e-05;
  local_4a8 = 0;
  local_4a0 = (Vn * Vn) / dVar22 + dVar9 / dVar20;
  local_498 = 0;
  uStack_490 = 0;
  local_488 = 0;
  local_480 = mahonyR[2];
  local_478 = mahonyR[5];
  local_470 = mahonyR[8];
  local_458 = 0;
  uStack_420 = 0;
  local_3f8 = 0;
  local_408 = 0;
  uStack_400 = 0;
  local_418 = 0;
  uStack_410 = 0;
  local_438 = 0;
  uStack_430 = 0;
  local_448 = 0;
  uStack_440 = 0;
  local_468 = 0;
  uStack_460 = 0;
  dStack_450 = 1.0 / dVar5;
  local_428 = -Vn / dVar22;
  local_380 = 0;
  local_390 = 0;
  uStack_388 = 0;
  local_3a0 = 0;
  uStack_398 = 0;
  local_3b0 = 0.0;
  uStack_3a8 = 0;
  local_3c0 = 0.0;
  uStack_3b8 = 0;
  local_3d0 = 0.0;
  uStack_3c8 = 0;
  local_3e0 = 0;
  uStack_3d8 = 0;
  local_3f0 = 0;
  uStack_3e8 = 0;
  dVar1 = cos(L);
  local_3d0 = 1.0 / (dVar1 * dVar4);
  dVar1 = tan(L);
  dVar2 = cos(L);
  local_3c0 = (dVar1 * Ve) / (dVar2 * dVar4);
  dVar1 = cos(L);
  local_3b0 = -Ve / (dVar1 * dVar20);
  puVar16 = &DAT_001093c0;
  puVar17 = local_378;
  for (lVar15 = 0xf; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar17 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
    puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
  }
  local_2c0 = 0;
  local_290 = 0;
  local_2a0 = 0;
  uStack_298 = 0;
  local_2b0 = 0;
  uStack_2a8 = 0;
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_2e0 = 0;
  uStack_2d8 = 0;
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_300 = 0;
  uStack_2f8 = 0;
  uStack_230 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_218 = 0;
  local_1a0 = 0;
  local_1b0 = 0;
  uStack_1a8 = 0;
  local_1c0 = 0;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1e0 = 0;
  uStack_1d8 = 0;
  local_1f0 = 0;
  uStack_1e8 = 0;
  local_200 = 0;
  uStack_1f8 = 0;
  local_210 = 0;
  uStack_208 = 0;
  local_128 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_b0 = 0;
  local_c0 = 0;
  local_d0 = 0;
  uStack_c8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  local_f0 = 0;
  uStack_e8 = 0;
  local_100 = 0;
  uStack_f8 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_120 = 0;
  uStack_118 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  dStack_2b8 = dVar21;
  local_238 = dVar21;
  dStack_1b8 = dVar21;
  local_138 = dVar6;
  dStack_b8 = dVar6;
  local_38 = dVar6;
  memset(&local_a08,0,0x2d0);
  local_a08 = *mahonyR;
  local_a00 = mahonyR[3];
  local_9f8 = mahonyR[6];
  local_9d8 = mahonyR[1];
  local_9d0 = mahonyR[4];
  local_9c8 = mahonyR[7];
  local_9a8 = mahonyR[2];
  local_9a0 = mahonyR[5];
  local_998 = mahonyR[8];
  local_960 = local_a08;
  local_958 = local_a00;
  local_950 = local_9f8;
  local_930 = local_9d8;
  local_928 = local_9d0;
  local_920 = local_9c8;
  local_900 = local_9a8;
  local_8f8 = local_9a0;
  local_8f0 = local_998;
  memset(local_8e8,0,0x1b0);
  memset(local_cd8,0,0x2d0);
  local_ca8 = dVar5;
  local_c28 = cos(L);
  local_c28 = local_c28 * dVar4;
  puVar16 = &DAT_00109438;
  puVar17 = local_be8;
  for (lVar15 = 0xf; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar17 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
    puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
  }
  puVar16 = &DAT_001094b0;
  puVar17 = local_b70;
  for (lVar15 = 0xf; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar17 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
    puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
  }
  puVar16 = &DAT_00109528;
  puVar17 = local_af8;
  for (lVar15 = 0xf; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar17 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
    puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
  }
  puVar16 = &DAT_001095a0;
  puVar17 = local_a80;
  for (lVar15 = 0xf; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar17 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
    puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
  }
  pdVar11 = MatEye(0xf);
  pdVar12 = MatMulk(&local_738,0xf,0xf,tao);
  pdVar12 = MatAdd(pdVar11,pdVar12,0xf,0xf);
  pdVar13 = MatMulk(&local_a08,0xf,6,tao);
  X = MatMul(pdVar12,0xf,0xf,X,0xf,1);
  pdVar14 = MatMul(pdVar12,0xf,0xf,PP,0xf,0xf);
  pdVar12 = MatT(pdVar12,0xf,0xf);
  pdVar12 = MatMul(pdVar14,0xf,0xf,pdVar12,0xf,0xf);
  pdVar14 = MatMul(pdVar13,0xf,6,Q,6,6);
  pdVar13 = MatT(pdVar13,0xf,6);
  pdVar13 = MatMul(pdVar14,0xf,6,pdVar13,6,0xf);
  pdVar12 = MatAdd(pdVar12,pdVar13,0xf,0xf);
  pdVar13 = MatMul(local_cd8,6,0xf,pdVar12,0xf,0xf);
  pdVar14 = MatT(local_cd8,6,0xf);
  pdVar13 = MatMul(pdVar13,6,0xf,pdVar14,0xf,6);
  pdVar13 = MatAdd(pdVar13,R,6,6);
  pdVar14 = MatT(local_cd8,6,0xf);
  pdVar14 = MatMul(pdVar12,0xf,0xf,pdVar14,0xf,6);
  pdVar13 = MatInv(pdVar13,6,6);
  pdVar13 = MatMul(pdVar14,0xf,6,pdVar13,6,6);
  pdVar14 = MatMul(pdVar13,0xf,6,local_cd8,6,0xf);
  pdVar11 = MatSub(pdVar11,pdVar14,0xf,0xf);
  PP = MatMul(pdVar11,0xf,0xf,pdVar12,0xf,0xf);
  pdVar11 = MatMul(local_cd8,6,0xf,X,0xf,1);
  pdVar12 = MatSub(Dpv,pdVar11,6,1);
  pdVar11 = X;
  pdVar12 = MatMul(pdVar13,0xf,6,pdVar12,6,1);
  pdVar11 = MatAdd(pdVar11,pdVar12,0xf,1);
  return pdVar11;
}

Assistant:

double* kalman_GPS_INS_pv(double* Dpv,double Ve,double Vn,double Vu,double L,double h,double* mahonyR,double* Fn,double tao,double Rm,double Rn) {
//    FILE *f_w = fopen("w.csv","a"),*f_z = fopen("z.csv","a");
    Q_wa = pow(((0.5e-4)*G0),2);//加速度计的随机偏差为0.5e-4*g
    double Q_diag[6] = {Q_wg, Q_wg, Q_wg, Q_wa, Q_wa, Q_wa};
    double Rk[6] = {Rlamt, Rl, Rh, Rvx, Rvy, Rvz};
    double PP0k[15] = {(0.1/(57))*(0.1/(57)), (0.1/(57))*(0.1/(57)), (0.1/(57))*(0.1/(57)),
                       0.01*0.01, 0.01*0.01, 0.01*0.01,0, 0, 0,
                       (0.1/(57*3600))*(0.1/(57*3600)), (0.1/(57*3600))*(0.1/(57*3600)), (0.1/(57*3600))*(0.1/(57*3600)),
                       ((1e-4)*G0)*((1e-4)*G0), ((1e-4)*G0)*((1e-4)*G0), ((1e-4)*G0)*((1e-4)*G0)};
    double wie = 7.292e-5;
    Q = MatDiag(Q_diag,6);
    R = MatDiag(Rk,6);
    if(PP == NULL)
        PP = MatDiag(PP0k,15);
    if(X == NULL){
        X = (double*)malloc(sizeof(double) * 15);
        memset(X,0,15 * sizeof(double));
    }
    
    double fe = Fn[0];
    double fn = Fn[1];
    double fu = Fn[2];
    //连续系统状态转换阵 F 的时间更新
    double secL2 = (1 / (sin(L) * sin(L)));
    double Rnh2 = (Rn + h) * (Rn + h);
    double Rmh2 = ((Rm + h) * (Rm + h));
    double tg = Tg[0];
    double ta = Ta[0];

    double* F = (double*)malloc(sizeof(double) * 225);
    double matrixF[15][15] = {
            {0, -wie * sin(L) - Ve * tan(L) / (Rn + h), Vn / (Rm + h), 0, 1 / (Rn + h), 0, -wie * sin(L), 0, -Ve / Rnh2, mahonyR[0], mahonyR[3], mahonyR[6], 0, 0, 0},
            {wie * sin(L) + Ve * tan(L) / (Rn + h), 0, wie * cos(L) + Ve / (Rn + h), -1 / (Rm + h), 0, 0, 0, 0, Vn / Rmh2, mahonyR[1], mahonyR[4], mahonyR[7], 0, 0, 0},
            {-Vn / (Rm + h), -wie * cos(L) - Ve / (Rn + h), 0, 0, -tan(L) / (Rn + h), 0, -wie * cos(L) - Ve * secL2 / (Rn + h), 0, Ve * tan(L) / Rnh2, mahonyR[2], mahonyR[5], mahonyR[8], 0, 0, 0},
            {0, -fu, fe, Vu / (Rm + h), -2 * wie * sin(L) - Ve * tan(L) / (Rn + h) - Ve * tan(L) / (Rn + h), Vn / (Rm + h), -2 * wie * cos(L) * Ve - Ve * Ve * secL2 / (Rn + h), 0, Ve * Ve * tan(L) / Rnh2 - Vn * Vu / Rmh2, 0, 0, 0, mahonyR[0], mahonyR[3], mahonyR[6]},
            {fu, 0, -fn, 2 * wie * sin(L) + Ve * tan(L) / (Rn + h), (Vn * tan(L) + Vu) / (Rn + h), 2 * wie * cos(L) + Ve / (Rn + h), (2 * wie * cos(L) + Ve * (secL2) / (Rn + h)) * Vn - 2 * wie * Vu * sin(L), 0, (Ve * Vn * tan(L) - Ve * Vu) / Rnh2, 0, 0, 0,mahonyR[1], mahonyR[4], mahonyR[7]},
            {-fe, fn, 0, -Vn / (Rm + h), -2 * wie * cos(L) - 2 * Ve / (Rn + h), 0, 2 * Ve * wie * sin(L), 0, Ve * Ve / Rnh2 + Vn * Vn / Rmh2, 0, 0, 0, mahonyR[2], mahonyR[5], mahonyR[8]},
            {0, 0, 0, 1 / (Rm + h), 0, 0, 0, 0, -Vn / Rmh2, 0, 0, 0, 0, 0, 0},
            {0, 0, 0, 0, 1 / ((Rn + h) * cos(L)), 0, Ve * tan(L) / ((Rn + h) * cos(L)), 0, -Ve / (cos(L) * Rnh2), 0, 0, 0, 0, 0, 0},
            {0, 0, 0, 0, 0, -1, 0, 0, 0, 0, 0, 0, 0, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / tg, 0, 0, 0, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / tg, 0, 0, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / tg, 0, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / ta, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / ta, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / ta}
    };
    F = (double*)matrixF;//15*15

    double* G = (double*)malloc(sizeof(double) * 90);

    double matrixG[15][6] = {
            {mahonyR[0], mahonyR[3], mahonyR[6],0,0,0},
            {mahonyR[1], mahonyR[4], mahonyR[7],0,0,0},
            {mahonyR[2], mahonyR[5], mahonyR[8],0,0,0},
            {0, 0, 0, mahonyR[0], mahonyR[3], mahonyR[6]},
            {0, 0, 0, mahonyR[1], mahonyR[4], mahonyR[7]},
            {0, 0, 0, mahonyR[2], mahonyR[5], mahonyR[8]},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0}
    };
    G = (double*)matrixG;//15*6

    double* H = (double*)malloc(sizeof(double) * 90);
    double matrixH[6][15] = {
            {0, 0 , 0 , 0 , 0 , 0 , Rm+h , 0,0,0,0,0,0,0,0},
            {0 , 0 , 0 , 0 , 0 , 0 , 0 , (Rn+h)*cos(L) , 0 , 0 , 0 , 0 , 0 , 0 , 0},
            {0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 1 , 0 , 0 , 0 , 0 , 0 , 0},
            {0 , 0 , 0 , 1 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0},
            {0 , 0 , 0 , 0 , 1 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0},
            {0 , 0 , 0 , 0 , 0 , 1 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0},
    };
    H = (double*)matrixH;//6*15

    //连续系统离散化
    double* eye15 = MatEye(15);
    double* A = MatAdd(eye15,MatMulk(F,15,15,tao),15,15);
    double* B = MatMulk(G,15,6,tao);

    //卡尔曼滤波开始
   // printf("Now Here is the KF:\n");

    X = MatMul(A,15,15,X,15,1);
//    printf("X:\n");
//    MatShow(X,15,1);

    double* P = MatAdd(MatMul(MatMul(A,15,15,PP,15,15),15,15,MatT(A,15,15),15,15),MatMul(MatMul(B,15,6,Q,6,6),15,6,MatT(B,15,6),6,15),15,15);
//    printf("P:\n");
//    MatShow(P,15,15);

    double* Y = MatAdd(MatMul(MatMul(H,6,15,P,15,15),6,15,MatT(H,6,15),15,6),R,6,6);//6*6
//    printf("Y:\n");
//    MatShow(Y,6,6);

    double* K = MatMul(MatMul(P,15,15,MatT(H,6,15),15,6),15,6,MatInv(Y,6,6),6,6);//15*6
//    printf("K:\n");
//    MatShow(K,15,6);

    PP = MatMul(MatSub(eye15,MatMul(K,15,6,H,6,15),15,15),15,15,P,15,15);
//    printf("PP:\n");
//    MatShow(PP,15,15);

    double* Z = Dpv;
//    char z_string[1000];
//    sprintf(z_string,"%f,%f,%f,%f,%f,%f\n",Z[0],Z[1],Z[2],Z[3],Z[4],Z[5]);
//    fprintf(f_z,z_string,1000);
//    fclose(f_z);

    double* W = MatSub(Z,MatMul(H,6,15,X,15,1),6,1);
//    printf("W:\n");
//    MatShow(W,6,1);
//    char w_string[1000];
//    sprintf(w_string,"%f,%f,%f,%f,%f,%f\n",W[0],W[1],W[2],W[3],W[4],W[5]);
//    fprintf(f_w,w_string,1000);
//    fclose(f_w);

    double* XX = MatAdd(X,MatMul(K,15,6,W,6,1),15,1);
//    printf("XX:\n");
//    MatShow(XX,15,1);

    return XX;
}